

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transit.cpp
# Opt level: O2

int __thiscall
Vault::Transit::sign
          (Transit *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  Client *client;
  string local_d0;
  Path local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Url local_70;
  string local_50;
  
  client = *(Client **)ctx;
  Vault::operator+(&local_50,"sign/",
                   (Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)sig);
  std::operator+(&local_90,&local_50,"/");
  Vault::operator+(&local_d0,&local_90,
                   (Tiny<Vault::AlgorithmDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)siglen);
  local_b0.value_._M_dataplus._M_p = (pointer)&local_b0.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
    local_b0.value_.field_2._8_8_ = local_d0.field_2._8_8_;
  }
  else {
    local_b0.value_._M_dataplus._M_p = local_d0._M_dataplus._M_p;
  }
  local_b0.value_._M_string_length = local_d0._M_string_length;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  getUrl(&local_70,(Transit *)ctx,&local_b0);
  HttpConsumer::post((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,client,&local_70,(Parameters *)tbs);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  return (int)this;
}

Assistant:

std::optional<std::string> Vault::Transit::sign(const Path &key,
                                                const Algorithm &algorithm,
                                                const Parameters &parameters) {
  return HttpConsumer::post(
      client_, getUrl(Path{"sign/" + key + "/" + algorithm}), parameters);
}